

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O1

void helicsEndpointSendBytes
               (HelicsEndpoint endpoint,void *data,int inputDataLength,HelicsError *err)

{
  undefined8 *puVar1;
  undefined7 uVar2;
  uint in_R8D;
  int __flags;
  bool bVar3;
  
  uVar2 = (undefined7)((ulong)err >> 8);
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (endpoint == (HelicsEndpoint)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001ae206;
    }
    else {
      bVar3 = *(int *)((long)endpoint + 0x20) == -0x4bac6b3e;
      puVar1 = (undefined8 *)0x0;
      if (bVar3) {
        puVar1 = (undefined8 *)endpoint;
      }
      in_R8D = in_R8D & 0xffffff00;
      if (bVar3 || err == (HelicsError *)0x0) goto LAB_001ae208;
    }
    err->error_code = -3;
    err->message = "The given endpoint does not point to a valid object";
  }
LAB_001ae206:
  puVar1 = (undefined8 *)0x0;
LAB_001ae208:
  if (puVar1 != (undefined8 *)0x0) {
    bVar3 = data != (void *)0x0;
    __flags = CONCAT31((int3)(in_R8D >> 8),0 < inputDataLength);
    if (bVar3 && 0 < inputDataLength) {
      helics::Endpoint::send
                ((Endpoint *)*puVar1,(int)data,(void *)(ulong)(uint)inputDataLength,
                 CONCAT71(uVar2,bVar3),__flags);
    }
    else {
      helics::Endpoint::send
                ((Endpoint *)*puVar1,(int)gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p,
                 (void *)gHelicsEmptyStr_abi_cxx11_._M_string_length,CONCAT71(uVar2,bVar3),__flags);
    }
  }
  return;
}

Assistant:

void helicsEndpointSendBytes(HelicsEndpoint endpoint, const void* data, int inputDataLength, HelicsError* err)
{
    auto* endObj = verifyEndpoint(endpoint, err);
    if (endObj == nullptr) {
        return;
    }
    try {
        if ((data == nullptr) || (inputDataLength <= 0)) {
            endObj->endPtr->send(gHelicsEmptyStr);
        } else {
            endObj->endPtr->send(reinterpret_cast<const char*>(data), inputDataLength);
        }
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}